

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visualOutput.cpp
# Opt level: O3

outputArrow * __thiscall
visualOutput::initArrow(visualOutput *this,int8_t nodeIndex,int8_t arrowIndex)

{
  WINDOW *pWVar1;
  pointer pcVar2;
  arrowType *paVar3;
  outputArrow *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  int arrowIndex_00;
  int iVar5;
  undefined7 in_register_00000031;
  _Alloc_hider _Var6;
  int iVar7;
  int iVar8;
  arrowType *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  iVar5 = (int)CONCAT71(in_register_00000031,nodeIndex);
  pWVar1 = grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
           _M_start[iVar5].w_main;
  if (pWVar1 == (WINDOW *)0x0) {
    iVar7 = -1;
    iVar8 = -1;
  }
  else {
    iVar7 = (int)pWVar1->_begy;
    iVar8 = (int)pWVar1->_begx;
  }
  arrowIndex_00 = (int)arrowIndex;
  this_00 = (outputArrow *)operator_new(0x20);
  if (arrowIndex_00 == 2) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    pcVar2 = (this->super_output).lbl._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar2,pcVar2 + (this->super_output).lbl._M_string_length);
    outputArrow::outputArrow(this_00,nodeIndex,iVar7 + 0xb,iVar8 + 7,2,&local_90);
    (this->super_output).outArr = this_00;
    paVar4 = &local_90.field_2;
    _Var6._M_p = local_90._M_dataplus._M_p;
  }
  else if (arrowIndex_00 == 1) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    pcVar2 = (this->super_output).lbl._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + (this->super_output).lbl._M_string_length);
    outputArrow::outputArrow(this_00,nodeIndex,iVar7 + 3,iVar8 + 0x1b,1,&local_70);
    (this->super_output).outArr = this_00;
    paVar4 = &local_70.field_2;
    _Var6._M_p = local_70._M_dataplus._M_p;
  }
  else if (arrowIndex == '\0') {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pcVar2 = (this->super_output).lbl._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + (this->super_output).lbl._M_string_length);
    outputArrow::outputArrow(this_00,nodeIndex,iVar7 + -1,iVar8 + 7,0,&local_50);
    (this->super_output).outArr = this_00;
    paVar4 = &local_50.field_2;
    _Var6._M_p = local_50._M_dataplus._M_p;
  }
  else {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    pcVar2 = (this->super_output).lbl._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar2,pcVar2 + (this->super_output).lbl._M_string_length);
    outputArrow::outputArrow(this_00,nodeIndex,iVar7 + 3,iVar8 + -4,arrowIndex_00,&local_b0);
    (this->super_output).outArr = this_00;
    paVar4 = &local_b0.field_2;
    _Var6._M_p = local_b0._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var6._M_p != paVar4) {
    operator_delete(_Var6._M_p,paVar4->_M_allocated_capacity + 1);
  }
  local_b8 = &((this->super_output).outArr)->super_arrowType;
  if (gridArrows.super__Vector_base<arrowType_*,_std::allocator<arrowType_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      gridArrows.super__Vector_base<arrowType_*,_std::allocator<arrowType_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<arrowType*,std::allocator<arrowType*>>::_M_realloc_insert<arrowType*>
              ((vector<arrowType*,std::allocator<arrowType*>> *)&gridArrows,
               (iterator)
               gridArrows.super__Vector_base<arrowType_*,_std::allocator<arrowType_*>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_b8);
  }
  else {
    *gridArrows.super__Vector_base<arrowType_*,_std::allocator<arrowType_*>_>._M_impl.
     super__Vector_impl_data._M_finish = local_b8;
    gridArrows.super__Vector_base<arrowType_*,_std::allocator<arrowType_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         gridArrows.super__Vector_base<arrowType_*,_std::allocator<arrowType_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  paVar3 = &((this->super_output).outArr)->super_arrowType;
  grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data._M_start
  [iVar5].arrows[arrowIndex] = paVar3;
  wrefresh(paVar3->win);
  return (this->super_output).outArr;
}

Assistant:

outputArrow *visualOutput::initArrow(int8_t nodeIndex, int8_t arrowIndex) {
	int y, x;
	getbegyx(grid[nodeIndex].w_main, y, x);

	if (arrowIndex == 0)
		outArr = new outputArrow(nodeIndex, y - ARROW_V_HEIGHT, x + floor(NODE_WIDTH / 2) - floor(ARROW_V_WIDTH / 2), arrowIndex, lbl);
	else if (arrowIndex == 1)
		outArr = new outputArrow(nodeIndex, y + floor(NODE_HEIGHT / 2) - floor(ARROW_H_HEIGHT / 2), x + NODE_WIDTH + GAP_WIDTH_H, arrowIndex, lbl);
	else if (arrowIndex == 2)
		outArr = new outputArrow(nodeIndex, y + NODE_HEIGHT + GAP_WIDTH_V, x + floor(NODE_WIDTH / 2) - floor(ARROW_V_WIDTH / 2), arrowIndex, lbl);
	else
		outArr = new outputArrow(nodeIndex, y + floor(NODE_HEIGHT / 2) - floor(ARROW_H_HEIGHT / 2), x - ARROW_H_WIDTH, arrowIndex, lbl);

	gridArrows.push_back(outArr);
	grid[nodeIndex].arrows[arrowIndex] = outArr;

	wrefresh(outArr->win);

	return outArr;
}